

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerGLSL::emit_complex_bitcast
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t op0)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool forwarding;
  SPIRType *pSVar2;
  SPIRType *pSVar3;
  char (*in_R8) [3];
  bool bVar4;
  string expr;
  string local_90;
  string local_70;
  string local_50;
  
  pSVar2 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      result_type);
  pSVar3 = Compiler::expression_type(&this->super_Compiler,op0);
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  if (pSVar3->vecsize == 1 && (pSVar3->basetype == Float && pSVar2->basetype == Half)) {
    to_unpacked_expression_abi_cxx11_(&local_90,this,op0,true);
    join<char_const(&)[33],std::__cxx11::string,char_const(&)[3]>
              (&local_70,(spirv_cross *)"unpackFloat2x16(floatBitsToUint(",(char (*) [33])&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a02a0,in_R8);
  }
  else {
    if (pSVar3->vecsize != 2 || (pSVar3->basetype != Half || pSVar2->basetype != Float)) {
      bVar4 = false;
      goto LAB_002e3511;
    }
    to_unpacked_expression_abi_cxx11_(&local_90,this,op0,true);
    join<char_const(&)[31],std::__cxx11::string,char_const(&)[3]>
              (&local_70,(spirv_cross *)"uintBitsToFloat(packFloat2x16(",(char (*) [31])&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a02a0,in_R8);
  }
  ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  forwarding = should_forward(this,op0);
  bVar4 = true;
  emit_op(this,result_type,id,&local_50,forwarding,false);
LAB_002e3511:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return bVar4;
}

Assistant:

bool CompilerGLSL::emit_complex_bitcast(uint32_t result_type, uint32_t id, uint32_t op0)
{
	// Some bitcasts may require complex casting sequences, and are implemented here.
	// Otherwise a simply unary function will do with bitcast_glsl_op.

	auto &output_type = get<SPIRType>(result_type);
	auto &input_type = expression_type(op0);
	string expr;

	if (output_type.basetype == SPIRType::Half && input_type.basetype == SPIRType::Float && input_type.vecsize == 1)
		expr = join("unpackFloat2x16(floatBitsToUint(", to_unpacked_expression(op0), "))");
	else if (output_type.basetype == SPIRType::Float && input_type.basetype == SPIRType::Half &&
	         input_type.vecsize == 2)
		expr = join("uintBitsToFloat(packFloat2x16(", to_unpacked_expression(op0), "))");
	else
		return false;

	emit_op(result_type, id, expr, should_forward(op0));
	return true;
}